

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O2

double Abc_GraphCountPaths_rec
                 (int Lev,int Node,Vec_Wec_t *vNodes,double **pCache,int *pBuffer,Vec_Int_t *vEdges)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  double dVar3;
  double dVar4;
  
  if (Node == -2) {
    dVar3 = 1.0;
  }
  else if (Node == -1) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = pCache[Lev][Node];
    if ((dVar3 == -1.0) && (!NAN(dVar3))) {
      pBuffer[Lev] = 0;
      pVVar2 = Vec_WecEntry(vNodes,Lev);
      iVar1 = Vec_IntEntry(pVVar2,Node * 2);
      dVar4 = Abc_GraphCountPaths_rec(Lev + 1,iVar1,vNodes,pCache,pBuffer,vEdges);
      pBuffer[Lev] = 1;
      pVVar2 = Vec_WecEntry(vNodes,Lev);
      iVar1 = Vec_IntEntry(pVVar2,Node * 2 + 1);
      dVar3 = Abc_GraphCountPaths_rec(Lev + 1,iVar1,vNodes,pCache,pBuffer,vEdges);
      dVar3 = dVar3 + dVar4;
      pCache[Lev][Node] = dVar3;
    }
  }
  return dVar3;
}

Assistant:

double Abc_GraphCountPaths_rec( int Lev, int Node, Vec_Wec_t * vNodes, double ** pCache, int * pBuffer, Vec_Int_t * vEdges )
{
    double Res0, Res1;
//    if ( Node == -2 ) Abc_GraphPathPrint4( pBuffer, vEdges );
    if ( Node == -2 )
        return 1;
    if ( Node == -1 )
        return 0;
    if ( pCache[Lev][Node] != -1.0 )
        return pCache[Lev][Node];
    pBuffer[Lev] = 0;
    Res0 = Abc_GraphCountPaths_rec( Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node   ), vNodes, pCache, pBuffer, vEdges );
    pBuffer[Lev] = 1;
    Res1 = Abc_GraphCountPaths_rec( Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node+1 ), vNodes, pCache, pBuffer, vEdges );
    return (pCache[Lev][Node] = Res0 + Res1);
}